

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FASTCOVER_buildDictionary
                 (FASTCOVER_ctx_t *ctx,U32 *freqs,void *dictBuffer,size_t dictBufferCapacity,
                 ZDICT_cover_params_t parameters,U16 *segmentFreqs)

{
  U16 *pUVar1;
  U32 f;
  COVER_epoch_info_t CVar2;
  size_t sVar3;
  clock_t cVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  uint local_b4;
  uint local_ac;
  size_t local_a0;
  
  CVar2 = COVER_computeEpochs((U32)dictBufferCapacity,(U32)ctx->nbDmers,parameters.k,1);
  if (1 < g_displayLevel) {
    FASTCOVER_buildDictionary_cold_1();
  }
  if (dictBufferCapacity == 0) {
    local_a0 = 0;
    sVar3 = local_a0;
  }
  else {
    local_a0 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      uVar11 = uVar7 * ((ulong)CVar2 >> 0x20);
      uVar10 = (uint)uVar11;
      uVar5 = uVar10 + CVar2.size;
      f = ctx->f;
      if (uVar10 < uVar5) {
        uVar14 = uVar11 & 0xffffffff;
        uVar12 = 0;
        uVar13 = 0;
        uVar9 = 0;
        local_b4 = 0;
        uVar8 = uVar10;
        do {
          uVar8 = uVar8 + 1;
          sVar3 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar14,f,parameters.d);
          if (segmentFreqs[sVar3] == 0) {
            local_b4 = local_b4 + freqs[sVar3];
          }
          segmentFreqs[sVar3] = segmentFreqs[sVar3] + 1;
          if (((parameters.d - parameters.k) + uVar8) - (int)uVar11 == 2) {
            sVar3 = FASTCOVER_hashPtrToIndex(ctx->samples + (uVar11 & 0xffffffff),f,parameters.d);
            pUVar1 = segmentFreqs + sVar3;
            *pUVar1 = *pUVar1 - 1;
            if (*pUVar1 == 0) {
              local_b4 = local_b4 - freqs[sVar3];
            }
            uVar11 = (ulong)((int)uVar11 + 1);
          }
          uVar10 = (uint)uVar11;
          uVar14 = uVar14 + 1;
          if (uVar9 < local_b4) {
            uVar12 = uVar11 & 0xffffffff;
            uVar9 = local_b4;
            uVar13 = uVar8;
          }
        } while (uVar5 != uVar14);
        local_ac = (uint)uVar12;
        bVar15 = uVar9 == 0;
      }
      else {
        bVar15 = true;
        uVar13 = 0;
        local_ac = 0;
      }
      uVar8 = local_ac;
      if (uVar10 < uVar5) {
        uVar11 = (ulong)uVar10;
        do {
          sVar3 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar11,f,parameters.d);
          segmentFreqs[sVar3] = segmentFreqs[sVar3] - 1;
          uVar11 = uVar11 + 1;
        } while (uVar5 != uVar11);
      }
      for (; uVar8 != uVar13; uVar8 = uVar8 + 1) {
        sVar3 = FASTCOVER_hashPtrToIndex(ctx->samples + uVar8,f,parameters.d);
        freqs[sVar3] = 0;
      }
      if (bVar15) {
        uVar6 = uVar6 + 1;
        bVar15 = 9 < uVar6;
      }
      else {
        uVar6 = (ulong)((uVar13 + (parameters.d - 1)) - local_ac);
        if (dictBufferCapacity < uVar6) {
          uVar6 = dictBufferCapacity;
        }
        if (uVar6 < parameters.d) {
          bVar15 = true;
          uVar6 = 0;
        }
        else {
          dictBufferCapacity = dictBufferCapacity - uVar6;
          memcpy((void *)((long)dictBuffer + dictBufferCapacity),ctx->samples + local_ac,uVar6);
          if ((1 < g_displayLevel) &&
             ((cVar4 = clock(), 150000 < cVar4 - g_time || (3 < g_displayLevel)))) {
            FASTCOVER_buildDictionary_cold_2();
          }
          uVar6 = 0;
          bVar15 = false;
        }
      }
      sVar3 = dictBufferCapacity;
    } while ((!bVar15) &&
            (uVar7 = (uVar7 + 1) % ((ulong)CVar2 & 0xffffffff), sVar3 = local_a0,
            dictBufferCapacity != 0));
  }
  local_a0 = sVar3;
  if (1 < g_displayLevel) {
    FASTCOVER_buildDictionary_cold_3();
  }
  return local_a0;
}

Assistant:

static size_t
FASTCOVER_buildDictionary(const FASTCOVER_ctx_t* ctx,
                          U32* freqs,
                          void* dictBuffer, size_t dictBufferCapacity,
                          ZDICT_cover_params_t parameters,
                          U16* segmentFreqs)
{
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->nbDmers, parameters.k, 1);
  const size_t maxZeroScoreRun = 10;
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = FASTCOVER_selectSegment(
        ctx, freqs, epochBegin, epochEnd, parameters, segmentFreqs);

    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;

    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }

    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}